

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O0

void choose_boots_theme(artifact *art)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  wchar_t wVar4;
  activation *paVar5;
  wchar_t selection;
  artifact *art_local;
  
  uVar1 = Rand_div(100);
  uVar2 = Rand_div(5);
  art->to_a = art->to_a + (short)uVar2 + 7 + (short)(potential / 0x5dc);
  if ((int)uVar1 < 0x19) {
    if (L'ᆓ' < potential) {
      iVar3 = damroll(3,2);
      get_property(art,(object *)0x0,"speed",iVar3 + L'\x05',true);
    }
  }
  else if ((int)uVar1 < 0x23) {
    uVar1 = Rand_div(5);
    get_property(art,(object *)0x0,"nexus resistance",uVar1 * 5 + L'#',true);
    get_property(art,(object *)0x0,"feather falling",L'\0',true);
    uVar1 = Rand_div(5);
    if (uVar1 == 0) {
      wVar4 = lookup_curse("anti-teleportation");
      uVar1 = Rand_div(0x14);
      append_artifact_curse(art,wVar4,uVar1 + L'(');
      potential = potential + L'Ĭ';
    }
  }
  else if ((int)uVar1 < 0x32) {
    if (potential < L'ྠ') {
      if (potential < L'ߐ') {
        paVar5 = lookup_activation("RAND_TELEPORT1");
        art->activation = paVar5;
      }
      else {
        paVar5 = lookup_activation("RAND_TELEPORT2");
        art->activation = paVar5;
      }
    }
    else {
      paVar5 = lookup_activation("RAND_RECALL");
      art->activation = paVar5;
    }
    potential = (potential << 1) / 3;
    uVar1 = Rand_div(5);
    get_property(art,(object *)0x0,"nexus resistance",uVar1 * 5 + L'#',true);
    get_property(art,(object *)0x0,"trap immunity",L'\0',true);
    if (L'ϧ' < potential) {
      uVar1 = Rand_div(4);
      get_property(art,(object *)0x0,"dexterity",uVar1 + L'\x01',false);
    }
    uVar1 = Rand_div(5);
    if (uVar1 == 0) {
      wVar4 = lookup_curse("teleportation");
      uVar1 = Rand_div(0x14);
      append_artifact_curse(art,wVar4,uVar1 + L'(');
      potential = potential + L'd';
    }
  }
  else if ((int)uVar1 < 0x3c) {
    uVar1 = Rand_div(2);
    if (uVar1 == 0) {
      if (potential < L'ᕼ') {
        if (potential < L'ஸ') {
          paVar5 = lookup_activation("RAND_HEAL1");
          art->activation = paVar5;
        }
        else {
          paVar5 = lookup_activation("RAND_HEAL2");
          art->activation = paVar5;
        }
      }
      else {
        paVar5 = lookup_activation("RAND_HEAL3");
        art->activation = paVar5;
      }
    }
    get_property(art,(object *)0x0,"regeneration",L'\0',true);
    uVar1 = Rand_div(4);
    if (uVar1 == 0) {
      get_property(art,(object *)0x0,"extra moves",L'\x02',true);
    }
    else {
      get_property(art,(object *)0x0,"extra moves",L'\x01',true);
    }
    uVar1 = Rand_div(4);
    get_property(art,(object *)0x0,"constitution",uVar1 + L'\x01',false);
  }
  else if ((int)uVar1 < 0x46) {
    uVar1 = Rand_div(3);
    if ((uVar1 != 0) && (L'ৃ' < potential)) {
      paVar5 = lookup_activation("RAND_STORM_DANCE");
      art->activation = paVar5;
    }
    get_property(art,(object *)0x0,"feather falling",L'\0',true);
    uVar1 = Rand_div(4);
    get_property(art,(object *)0x0,"dexterity",uVar1 + L'\x01',false);
  }
  else if ((int)uVar1 < 0x50) {
    uVar1 = Rand_div(3);
    if (uVar1 != 0) {
      paVar5 = lookup_activation("RAND_DETECT_MONSTERS");
      art->activation = paVar5;
    }
    get_property(art,(object *)0x0,"regeneration",L'\0',true);
    get_property(art,(object *)0x0,"slow digestion",L'\0',true);
    uVar1 = Rand_div(6);
    if (uVar1 == 0) {
      get_property(art,(object *)0x0,"telepathy",L'\0',false);
    }
    uVar1 = Rand_div(4);
    get_property(art,(object *)0x0,"stealth",uVar1 + L'\x01',false);
  }
  uVar1 = Rand_div(4);
  if (((uVar1 == 0) && (art->activation == (activation *)0x0)) && (L'ߏ' < potential)) {
    paVar5 = lookup_activation("RAND_SPEED");
    art->activation = paVar5;
  }
  return;
}

Assistant:

static void choose_boots_theme(struct artifact *art)
{
	/* I'm a pair of boots... */
	int selection = randint0(100);

	/* ...with a bonus to armour class, and... */
	art->to_a += (6 + randint1(5) + potential / 1500);

	/* ...that makes he who wears me run like the wind. */
	if (selection < 25) {

		/* This is an exclusive club. */
		if (potential >= 4500) {

			/* Add a speed bonus immediately. */
			get_property(art, NULL, "speed", 5 + damroll(3, 2), true);
		}
	}

	/* ...that keeps a guy's feet on the ground. */
	else if (selection < 35) {

		/* Resist nexus and feather fall. */
		get_property(art, NULL, "nexus resistance", 35 + 5 * randint0(5), true);
		get_property(art, NULL, "feather falling", 0, true);

		/* Sometimes too much */
		if (one_in_(5)) {
			append_artifact_curse(art, lookup_curse("anti-teleportation"),
								  40 + randint0(20));
			potential += 300;
		}
	}

	/* ...with unrivaled magical movement. */
	else if (selection < 50) {

		/* Assign an activation,... */
		if (potential >= 4000) {
			art->activation = lookup_activation("RAND_RECALL");
		} else if (potential >= 2000) {
			art->activation = lookup_activation("RAND_TELEPORT2");
		} else {
			art->activation = lookup_activation("RAND_TELEPORT1");
		}

		/* ...but not for free. */
		potential = 2 * potential / 3;

		/* Resist nexus and immunity to traps */
		get_property(art, NULL, "nexus resistance", 35 + 5 * randint0(5), true);
		get_property(art, NULL, "trap immunity", 0, true);

		/* Possibly bonus to dexerity. */
		if (potential >= 1000)
			get_property(art, NULL, "dexterity", randint1(4), false);

		/* Sometimes too powerful */
		if (one_in_(5)) {
			append_artifact_curse(art, lookup_curse("teleportation"),
								  40 + randint0(20));
			potential += 100;
		}
	}

	/* ...that makes long marches easy. */
	else if (selection < 60) {

		/* Possibly assign an activation for free. */
		if (one_in_(2)) {
			if (potential >= 5500) {
				art->activation = lookup_activation("RAND_HEAL3");
			} else if (potential >= 3000) {
				art->activation = lookup_activation("RAND_HEAL2");
			} else {
				art->activation = lookup_activation("RAND_HEAL1");
			}
		}

		/* Grant regenerative powers. */
		get_property(art, NULL, "regeneration", 0, true);

		/* Extra moves */
		if (one_in_(4)) {
			get_property(art, NULL, "extra moves", 2, true);
		} else {
			get_property(art, NULL, "extra moves", 1, true);
		}

		/* Bonus to constitution. */
		get_property(art, NULL, "constitution", randint1(4), false);
	}

	/* ...that dance up a storm. */
	else if (selection < 70) {

		/* Possibly assign an activation for free. */
		if (!one_in_(3) && (potential >= 2500)) {
			art->activation = lookup_activation("RAND_STORM_DANCE");
		}

		/* Grant feather fall. */
		get_property(art, NULL, "feather falling", 0, true);

		/* Bonus to dexterity. */
		get_property(art, NULL, "dexterity", randint1(4), false);
	}

	/* ...worn by a famous ranger of old. */
	else if (selection < 80) {

		/* Possibly assign an activation for free. */
		if (!one_in_(3)) {
			art->activation = lookup_activation("RAND_DETECT_MONSTERS");
		}

		/* Grant regeneration and slow digest. */
		get_property(art, NULL, "regeneration", 0, true);
		get_property(art, NULL, "slow digestion", 0, true);

		/* Possibly telepathy. */
		if (one_in_(6)) {
			get_property(art, NULL, "telepathy", 0, false);
		}

		/* Bonus to stealth. */
		get_property(art, NULL, "stealth", randint1(4), false);
	}

	/* Possibly assign a speed activation for free. */
	if (one_in_(4) && (!art->activation) && (potential >= 2000)) {
		art->activation = lookup_activation("RAND_SPEED");
	}
}